

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

hash_entry_t * insert(hash_table_t *table,hash_key_t key,hash_data_t data,hash_hashvalue_t value)

{
  ulong uVar1;
  hash_entry_t *entry;
  unsigned_long startindex;
  unsigned_long index;
  hash_hashvalue_t value_local;
  hash_data_t data_local;
  hash_key_t key_local;
  hash_table_t *table_local;
  hash_entry_t *local_8;
  
  uVar1 = (ulong)(long)value % table->table_size;
  index = uVar1;
  do {
    local_8 = table->table + index;
    if ((local_8->status == 0) || (local_8->status == 1)) {
      local_8->key = key;
      local_8->data = data;
      local_8->hash_value = value;
      local_8->status = 2;
      break;
    }
    index = index + 1;
    if (index == table->table_size) {
      index = 0;
    }
  } while (index != uVar1);
  if (local_8 == (hash_entry_t *)0x0) {
    local_8 = (hash_entry_t *)0x0;
  }
  else {
    local_8->next = table->head;
    local_8->prev = (hash_entry_t *)0x0;
    if (table->head != (hash_entry_t *)0x0) {
      table->head->prev = local_8;
    }
    table->head = local_8;
    table->entry_count = table->entry_count + 1;
  }
  return local_8;
}

Assistant:

static hash_entry_t *insert(hash_table_t *table, hash_key_t key, hash_data_t data, hash_hashvalue_t value)
{
   unsigned long index = (unsigned long)value % table->table_size;
   unsigned long startindex = index;

   hash_entry_t *entry = NULL;
   do {
      entry = table->table + index;
      if (entry->status == EMPTY || entry->status == TOMBSTONE) {
         entry->key = key;
         entry->data = data;
         entry->hash_value = value;
         entry->status = INUSE;
         break;
      }
      index++;
      if (index == table->table_size)
         index = 0;
   } while (index != startindex);

   if (!entry)
      return NULL;

   entry->next = table->head;
   entry->prev = NULL;
   if (table->head)
      table->head->prev = entry;
   table->head = entry;
   table->entry_count++;         

   return entry;
}